

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool print_string_ptr(uchar *input,printbuffer *output_buffer)

{
  uchar uVar1;
  uchar *puVar2;
  uint uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *__s;
  long local_48;
  size_t escape_characters;
  size_t output_length;
  uchar *output_pointer;
  uchar *output;
  uchar *input_pointer;
  printbuffer *output_buffer_local;
  uchar *input_local;
  
  local_48 = 0;
  if (output_buffer == (printbuffer *)0x0) {
    input_local._4_4_ = 0;
  }
  else {
    output = input;
    if (input == (uchar *)0x0) {
      puVar4 = ensure(output_buffer,3);
      if (puVar4 == (uchar *)0x0) {
        input_local._4_4_ = 0;
      }
      else {
        strcpy((char *)puVar4,"\"\"");
        input_local._4_4_ = 1;
      }
    }
    else {
      for (; *output != '\0'; output = output + 1) {
        uVar3 = (uint)*output;
        if ((((uVar3 - 8 < 3) || (uVar3 - 0xc < 2)) || (uVar3 == 0x22)) || (uVar3 == 0x5c)) {
          local_48 = local_48 + 1;
        }
        else if (*output < 0x20) {
          local_48 = local_48 + 5;
        }
      }
      puVar4 = output + (local_48 - (long)input);
      puVar5 = ensure(output_buffer,(size_t)(puVar4 + 3));
      if (puVar5 == (uchar *)0x0) {
        input_local._4_4_ = 0;
      }
      else if (local_48 == 0) {
        *puVar5 = '\"';
        memcpy(puVar5 + 1,input,(size_t)puVar4);
        puVar5[(long)(puVar4 + 1)] = '\"';
        puVar5[(long)(puVar4 + 2)] = '\0';
        input_local._4_4_ = 1;
      }
      else {
        *puVar5 = '\"';
        puVar2 = puVar5;
        for (output = input; output_length = (long)puVar2 + 1, *output != '\0'; output = output + 1)
        {
          if (((*output < 0x20) || (*output == '\"')) || (*output == '\\')) {
            __s = puVar2 + 2;
            *(undefined1 *)output_length = 0x5c;
            uVar1 = *output;
            output_length = (size_t)__s;
            if (uVar1 == '\b') {
              *__s = 'b';
            }
            else if (uVar1 == '\t') {
              *__s = 't';
            }
            else if (uVar1 == '\n') {
              *__s = 'n';
            }
            else if (uVar1 == '\f') {
              *__s = 'f';
            }
            else if (uVar1 == '\r') {
              *__s = 'r';
            }
            else if (uVar1 == '\"') {
              *__s = '\"';
            }
            else if (uVar1 == '\\') {
              *__s = '\\';
            }
            else {
              sprintf((char *)__s,"u%04x",(ulong)*output);
              output_length = (size_t)(puVar2 + 6);
            }
          }
          else {
            *(uchar *)output_length = *output;
          }
          puVar2 = (uchar *)output_length;
        }
        puVar5[(long)(puVar4 + 1)] = '\"';
        puVar5[(long)(puVar4 + 2)] = '\0';
        input_local._4_4_ = 1;
      }
    }
  }
  return input_local._4_4_;
}

Assistant:

static cJSON_bool print_string_ptr(const unsigned char * const input, printbuffer * const output_buffer)
{
    const unsigned char *input_pointer = NULL;
    unsigned char *output = NULL;
    unsigned char *output_pointer = NULL;
    size_t output_length = 0;
    /* numbers of additional characters needed for escaping */
    size_t escape_characters = 0;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* empty string */
    if (input == NULL)
    {
        output = ensure(output_buffer, sizeof("\"\""));
        if (output == NULL)
        {
            return false;
        }
        strcpy((char*)output, "\"\"");

        return true;
    }

    /* set "flag" to 1 if something needs to be escaped */
    for (input_pointer = input; *input_pointer; input_pointer++)
    {
        switch (*input_pointer)
        {
            case '\"':
            case '\\':
            case '\b':
            case '\f':
            case '\n':
            case '\r':
            case '\t':
                /* one character escape sequence */
                escape_characters++;
                break;
            default:
                if (*input_pointer < 32)
                {
                    /* UTF-16 escape sequence uXXXX */
                    escape_characters += 5;
                }
                break;
        }
    }
    output_length = (size_t)(input_pointer - input) + escape_characters;

    output = ensure(output_buffer, output_length + sizeof("\"\""));
    if (output == NULL)
    {
        return false;
    }

    /* no characters have to be escaped */
    if (escape_characters == 0)
    {
        output[0] = '\"';
        memcpy(output + 1, input, output_length);
        output[output_length + 1] = '\"';
        output[output_length + 2] = '\0';

        return true;
    }

    output[0] = '\"';
    output_pointer = output + 1;
    /* copy the string */
    for (input_pointer = input; *input_pointer != '\0'; (void)input_pointer++, output_pointer++)
    {
        if ((*input_pointer > 31) && (*input_pointer != '\"') && (*input_pointer != '\\'))
        {
            /* normal character, copy */
            *output_pointer = *input_pointer;
        }
        else
        {
            /* character needs to be escaped */
            *output_pointer++ = '\\';
            switch (*input_pointer)
            {
                case '\\':
                    *output_pointer = '\\';
                    break;
                case '\"':
                    *output_pointer = '\"';
                    break;
                case '\b':
                    *output_pointer = 'b';
                    break;
                case '\f':
                    *output_pointer = 'f';
                    break;
                case '\n':
                    *output_pointer = 'n';
                    break;
                case '\r':
                    *output_pointer = 'r';
                    break;
                case '\t':
                    *output_pointer = 't';
                    break;
                default:
                    /* escape and print as unicode codepoint */
                    sprintf((char*)output_pointer, "u%04x", *input_pointer);
                    output_pointer += 4;
                    break;
            }
        }
    }
    output[output_length + 1] = '\"';
    output[output_length + 2] = '\0';

    return true;
}